

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_properties.h
# Opt level: O3

bool __thiscall
BamTools::PropertyFilterValue::check<signed_char>(PropertyFilterValue *this,char *query)

{
  char cVar1;
  bool bVar2;
  Impl<signed_char> *pIVar3;
  long lVar4;
  char *pcVar5;
  
  bVar2 = Variant::is_type<signed_char>(&this->Value);
  if (bVar2) {
    bVar2 = Variant::is_type<std::__cxx11::string>(&this->Value);
    if (bVar2) {
      pcVar5 = "Cannot compare different types - query is a string!";
      lVar4 = 0x33;
      goto LAB_0016349d;
    }
    switch(this->Type) {
    case EXACT:
      cVar1 = *query;
      pIVar3 = Variant::CastFromBase<signed_char>((this->Value).data);
      bVar2 = cVar1 == pIVar3->data;
      break;
    case GREATER_THAN:
      cVar1 = *query;
      pIVar3 = Variant::CastFromBase<signed_char>((this->Value).data);
      bVar2 = pIVar3->data < cVar1;
      break;
    case GREATER_THAN_EQUAL:
      cVar1 = *query;
      pIVar3 = Variant::CastFromBase<signed_char>((this->Value).data);
      bVar2 = pIVar3->data <= cVar1;
      break;
    case LESS_THAN:
      cVar1 = *query;
      pIVar3 = Variant::CastFromBase<signed_char>((this->Value).data);
      bVar2 = cVar1 < pIVar3->data;
      break;
    case LESS_THAN_EQUAL:
      cVar1 = *query;
      pIVar3 = Variant::CastFromBase<signed_char>((this->Value).data);
      bVar2 = cVar1 <= pIVar3->data;
      break;
    case NOT:
      cVar1 = *query;
      pIVar3 = Variant::CastFromBase<signed_char>((this->Value).data);
      bVar2 = cVar1 != pIVar3->data;
      break;
    default:
      goto switchD_001634ec_default;
    }
  }
  else {
    pcVar5 = "Cannot compare different types!";
    lVar4 = 0x1f;
LAB_0016349d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar4);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
switchD_001634ec_default:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool PropertyFilterValue::check(const T& query) const
{

    // ensure filter value & query are same type
    if (!Value.is_type<T>()) {
        std::cerr << "Cannot compare different types!" << std::endl;
        return false;
    }

    // string matching
    if (Value.is_type<std::string>()) {
        std::cerr << "Cannot compare different types - query is a string!" << std::endl;
        return false;
    }

    // numeric matching based on our filter type
    switch (Type) {
        case (PropertyFilterValue::EXACT):
            return (query == Value.get<T>());
        case (PropertyFilterValue::GREATER_THAN):
            return (query > Value.get<T>());
        case (PropertyFilterValue::GREATER_THAN_EQUAL):
            return (query >= Value.get<T>());
        case (PropertyFilterValue::LESS_THAN):
            return (query < Value.get<T>());
        case (PropertyFilterValue::LESS_THAN_EQUAL):
            return (query <= Value.get<T>());
        case (PropertyFilterValue::NOT):
            return (query != Value.get<T>());
        default:
            BAMTOOLS_ASSERT_UNREACHABLE;
    }
    return false;
}